

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  char *pcVar2;
  string *in_RDI;
  allocator<char> local_192;
  allocator<char> local_191;
  FilePath output_name;
  FilePath result;
  string format;
  FilePath local_130;
  FilePath local_110;
  string s;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&s,(string *)FLAGS_gtest_output_abi_cxx11_);
  GetOutputFormat_abi_cxx11_();
  if (format._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output_name,"xml",(allocator<char> *)&result);
    std::__cxx11::string::operator=((string *)&format,(string *)&output_name);
    std::__cxx11::string::_M_dispose();
  }
  pcVar2 = strchr(s._M_dataplus._M_p,0x3a);
  if (pcVar2 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)&local_130);
    FilePath::FilePath(&result,&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"test_detail",&local_192)
    ;
    FilePath::FilePath(&local_110,&local_70);
    FilePath::MakeFileName(&output_name,&result,&local_110,0,format._M_dataplus._M_p);
    std::__cxx11::string::string((string *)in_RDI,(string *)&output_name);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar2 + 1,(allocator<char> *)&result);
    FilePath::FilePath(&output_name,&local_90);
    std::__cxx11::string::_M_dispose();
    bVar1 = FilePath::IsAbsolutePath(&output_name);
    if (!bVar1) {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,&local_192);
      FilePath::FilePath(&local_110,&local_b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,pcVar2 + 1,&local_191);
      FilePath::FilePath(&local_130,&local_d0);
      FilePath::ConcatPaths(&result,&local_110,&local_130);
      std::__cxx11::string::operator=((string *)&output_name,(string *)&result);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    if ((output_name.pathname_._M_string_length == 0) ||
       (output_name.pathname_._M_dataplus._M_p[output_name.pathname_._M_string_length - 1] != '/'))
    {
      std::__cxx11::string::string((string *)in_RDI,(string *)&output_name);
    }
    else {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                (&result,&output_name,&local_110,local_130.pathname_._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::string((string *)in_RDI,(string *)&result);
      std::__cxx11::string::_M_dispose();
    }
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}